

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.h
# Opt level: O3

void __thiscall chrono::ChLinkLockPointPlane::~ChLinkLockPointPlane(ChLinkLockPointPlane *this)

{
  ChLinkLock::~ChLinkLock(&this->super_ChLinkLock);
  free((void *)this[-1].super_ChLinkLock.Ct_temp.rot.m_data[3]);
  return;
}

Assistant:

class ChApi ChLinkLockPointPlane : public ChLinkLock {
  public:
    ChLinkLockPointPlane() { ChangeLinkType(LinkType::POINTPLANE); }

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLinkLockPointPlane* Clone() const override { return new ChLinkLockPointPlane(*this); }

    /// Lock the joint.
    /// If enabled (lock = true) this effectively converts this joint into a weld joint.
    /// If lock = false, the joint reverts to its original degrees of freedom.
    void Lock(bool lock);
}